

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

size_t mspace_bulk_free(mspace msp,void **array,size_t nelem)

{
  mchunkptr p;
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (nelem != 0) {
    lVar6 = 0;
    do {
      lVar2 = *(long *)((long)array + lVar6);
      if (lVar2 != 0) {
        p = (mchunkptr)(lVar2 + -0x10);
        uVar4 = *(ulong *)(lVar2 + -8);
        *(undefined8 *)((long)array + lVar6) = 0;
        if ((p < *(mchunkptr *)((long)msp + 0x18)) || (uVar3 = (uint)uVar4, (uVar3 & 3) == 1)) {
          abort();
        }
        uVar4 = uVar4 & 0xfffffffffffffff8;
        if ((nelem * 8 + -8 == lVar6) ||
           (*(long *)((long)array + lVar6 + 8) != (long)&p->fd + uVar4)) {
          dispose_chunk((mstate)msp,p,uVar4);
        }
        else {
          lVar5 = (*(ulong *)(lVar2 + -8 + uVar4) & 0xfffffffffffffff8) + uVar4;
          *(ulong *)(lVar2 + -8) = (ulong)(uVar3 & 1) + 2 + lVar5;
          pbVar1 = (byte *)(lVar2 + -8 + lVar5);
          *pbVar1 = *pbVar1 | 1;
          *(long *)((long)array + lVar6 + 8) = lVar2;
        }
      }
      lVar6 = lVar6 + 8;
    } while (nelem << 3 != lVar6);
  }
  if (*(ulong *)((long)msp + 0x30) < *(ulong *)((long)msp + 0x10)) {
    sys_trim((mstate)msp,0);
  }
  return 0;
}

Assistant:

size_t mspace_bulk_free(mspace msp, void* array[], size_t nelem) {
  return internal_bulk_free((mstate)msp, array, nelem);
}